

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void dirty_index_consistency_test(void)

{
  fdb_status fVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  char *unaff_R14;
  fdb_doc *doc;
  fdb_file_handle *dbfile;
  fdb_iterator *fit;
  fdb_kvs_handle *db [2];
  fdb_doc *rdoc;
  timeval __test_begin;
  char valuebuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_520;
  fdb_file_handle *pfStack_518;
  fdb_kvs_handle *pfStack_510;
  fdb_kvs_config fStack_508;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined4 uStack_4d0;
  timeval atStack_4c8 [3];
  fdb_config fStack_490;
  fdb_config *pfStack_398;
  fdb_config *pfStack_390;
  fdb_doc *local_380;
  fdb_file_handle *local_378;
  fdb_iterator *local_370;
  fdb_kvs_handle *local_368;
  fdb_kvs_handle *local_360;
  fdb_doc *local_358;
  fdb_kvs_config local_350;
  timeval local_338;
  fdb_config local_328;
  fdb_config local_228;
  fdb_config local_128;
  
  pfStack_390 = (fdb_config *)0x11a336;
  gettimeofday(&local_338,(__timezone_ptr_t)0x0);
  pfStack_390 = (fdb_config *)0x11a33b;
  memleak_start();
  pfStack_390 = (fdb_config *)0x11a347;
  system("rm -rf  dummy* > errorlog.txt");
  pcVar2 = (char *)&local_128;
  pfStack_390 = (fdb_config *)0x11a357;
  fdb_get_default_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 100;
  pfStack_390 = (fdb_config *)0x11a371;
  fdb_get_default_kvs_config();
  pfStack_390 = (fdb_config *)0x11a385;
  fVar1 = fdb_open(&local_378,"dummy",(fdb_config *)pcVar2);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a672;
  pfStack_390 = (fdb_config *)0x11a3a3;
  fVar1 = fdb_kvs_open(local_378,&local_368,(char *)0x0,&local_350);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a677;
  pfStack_390 = (fdb_config *)0x11a3c1;
  fVar1 = fdb_kvs_open(local_378,&local_360,(char *)0x0,&local_350);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a67c;
  pcVar2 = (char *)&local_228;
  pfStack_390 = (fdb_config *)0x11a3e0;
  memset(pcVar2,0,0x100);
  unaff_R14 = (char *)&local_328;
  pfStack_390 = (fdb_config *)0x11a3f4;
  memset(unaff_R14,0,0x100);
  uVar4 = 0;
  do {
    pfStack_390 = (fdb_config *)0x11a418;
    sprintf(pcVar2,"k%06d",uVar4);
    pfStack_390 = (fdb_config *)0x11a427;
    sprintf(unaff_R14,"v%06d",uVar4);
    pfStack_390 = (fdb_config *)0x11a447;
    fdb_doc_create(&local_380,pcVar2,8,(void *)0x0,0,unaff_R14,9);
    pfStack_390 = (fdb_config *)0x11a456;
    fVar1 = fdb_set(local_360,local_380);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_390 = (fdb_config *)0x11a668;
      dirty_index_consistency_test();
      goto LAB_0011a668;
    }
    pfStack_390 = (fdb_config *)0x11a468;
    fdb_doc_free(local_380);
    uVar3 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar3;
  } while (uVar3 != 1000);
  pcVar2 = "k%06d";
  unaff_R14 = (char *)&local_228;
  uVar3 = 0;
  do {
    pfStack_390 = (fdb_config *)0x11a49c;
    sprintf(unaff_R14,"k%06d",(ulong)uVar3);
    pfStack_390 = (fdb_config *)0x11a4bc;
    fdb_doc_create(&local_380,unaff_R14,8,(void *)0x0,0,&local_328,9);
    pfStack_390 = (fdb_config *)0x11a4cb;
    fVar1 = fdb_get(local_368,local_380);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a668;
    pfStack_390 = (fdb_config *)0x11a4dd;
    fdb_doc_free(local_380);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 1000);
  pcVar2 = (char *)0x3e8;
  unaff_R14 = "k%06d";
  do {
    pfStack_390 = (fdb_config *)0x11a51b;
    sprintf((char *)&local_228,"k%06d",pcVar2);
    pfStack_390 = (fdb_config *)0x11a52a;
    sprintf((char *)&local_328,"v%06d",pcVar2);
    pfStack_390 = (fdb_config *)0x11a54a;
    fdb_doc_create(&local_380,&local_228,8,(void *)0x0,0,&local_328,9);
    pfStack_390 = (fdb_config *)0x11a559;
    fVar1 = fdb_set(local_360,local_380);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a66d;
    pfStack_390 = (fdb_config *)0x11a56b;
    fdb_doc_free(local_380);
    uVar3 = (int)pcVar2 + 1;
    pcVar2 = (char *)(ulong)uVar3;
  } while (uVar3 != 3000);
  pfStack_390 = (fdb_config *)0x11a584;
  fVar1 = fdb_commit(local_378,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a681;
  unaff_R14 = (char *)0x0;
  pfStack_390 = (fdb_config *)0x11a5af;
  fVar1 = fdb_iterator_init(local_360,&local_370,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a686;
  pcVar2 = (char *)&local_358;
  do {
    local_358 = (fdb_doc *)0x0;
    pfStack_390 = (fdb_config *)0x11a5d2;
    fVar1 = fdb_iterator_get(local_370,(fdb_doc **)pcVar2);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    unaff_R14 = (char *)(ulong)((int)unaff_R14 + 1);
    pfStack_390 = (fdb_config *)0x11a5e3;
    fdb_doc_free(local_358);
    pfStack_390 = (fdb_config *)0x11a5ed;
    fVar1 = fdb_iterator_next(local_370);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pfStack_390 = (fdb_config *)0x11a5fb;
  fdb_iterator_close(local_370);
  if ((int)unaff_R14 == 3000) {
    pfStack_390 = (fdb_config *)0x11a612;
    fVar1 = fdb_close(local_378);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_390 = (fdb_config *)0x11a61b;
      fdb_shutdown();
      pfStack_390 = (fdb_config *)0x11a620;
      memleak_end();
      pcVar2 = "%s PASSED\n";
      if (dirty_index_consistency_test()::__test_pass != '\0') {
        pcVar2 = "%s FAILED\n";
      }
      pfStack_390 = (fdb_config *)0x11a651;
      fprintf(_stderr,pcVar2,"dirty index consistency test");
      return;
    }
    goto LAB_0011a690;
  }
  goto LAB_0011a68b;
LAB_0011a668:
  pfStack_390 = (fdb_config *)0x11a66d;
  dirty_index_consistency_test();
LAB_0011a66d:
  pfStack_390 = (fdb_config *)0x11a672;
  dirty_index_consistency_test();
LAB_0011a672:
  pfStack_390 = (fdb_config *)0x11a677;
  dirty_index_consistency_test();
LAB_0011a677:
  pfStack_390 = (fdb_config *)0x11a67c;
  dirty_index_consistency_test();
LAB_0011a67c:
  pfStack_390 = (fdb_config *)0x11a681;
  dirty_index_consistency_test();
LAB_0011a681:
  pfStack_390 = (fdb_config *)0x11a686;
  dirty_index_consistency_test();
LAB_0011a686:
  pfStack_390 = (fdb_config *)0x11a68b;
  dirty_index_consistency_test();
LAB_0011a68b:
  pfStack_390 = (fdb_config *)0x11a690;
  dirty_index_consistency_test();
LAB_0011a690:
  pfStack_390 = (fdb_config *)apis_with_invalid_handles_test;
  dirty_index_consistency_test();
  pfStack_398 = (fdb_config *)pcVar2;
  pfStack_390 = (fdb_config *)unaff_R14;
  gettimeofday(atStack_4c8,(__timezone_ptr_t)0x0);
  pfStack_518 = (fdb_file_handle *)0x0;
  pfStack_520 = (fdb_kvs_handle *)0x0;
  pfStack_510 = (fdb_kvs_handle *)0x0;
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&pfStack_518,"dummy",&fStack_490);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_kvs_open(pfStack_518,&pfStack_520,(char *)0x0,&fStack_508);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_snapshot_open(pfStack_520,(fdb_kvs_handle **)0x0,0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)0x0,(fdb_kvs_handle **)0x0,0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_rollback(&pfStack_510,10);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)0x0,logCallbackFunc,(void *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_get_byoffset((fdb_kvs_handle *)0x0,(fdb_doc *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_set((fdb_kvs_handle *)0x0,(fdb_doc *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_del((fdb_kvs_handle *)0x0,(fdb_doc *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_commit((fdb_file_handle *)0x0,'\0');
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_compact((fdb_file_handle *)0x0,(char *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_compact_with_cow((fdb_file_handle *)0x0,(char *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  uStack_4e0 = 0;
  uStack_4d8 = 0;
  uStack_4f0 = 0;
  uStack_4e8 = 0;
  uStack_4d0 = 0;
  fVar1 = fdb_rekey((fdb_file_handle *)0x0,(fdb_encryption_key)ZEXT1636(ZEXT816(0)));
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_iterator_seek((fdb_iterator *)0x0,"key",3,'\0');
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_iterator_seek_to_min((fdb_iterator *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_iterator_seek_to_max((fdb_iterator *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_iterator_prev((fdb_iterator *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_iterator_next((fdb_iterator *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_iterator_get((fdb_iterator *)0x0,(fdb_doc **)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_iterator_get_metaonly((fdb_iterator *)0x0,(fdb_doc **)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_kvs_open((fdb_file_handle *)0x0,(fdb_kvs_handle **)0x0,(char *)0x0,&fStack_508);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_begin_transaction((fdb_file_handle *)0x0,'\x02');
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_abort_transaction((fdb_file_handle *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fVar1 = fdb_end_transaction((fdb_file_handle *)0x0,'\0');
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    apis_with_invalid_handles_test();
  }
  fdb_kvs_close(pfStack_520);
  fdb_close(pfStack_518);
  fdb_shutdown();
  memleak_end();
  pcVar2 = "%s PASSED\n";
  if (apis_with_invalid_handles_test()::__test_pass != '\0') {
    pcVar2 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar2,"apis with invalid handles test");
  return;
}

Assistant:

void dirty_index_consistency_test()
{
    TEST_INIT();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db[2];
    fdb_iterator *fit;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc, *rdoc;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256];

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.wal_threshold = 100;
    kvs_config = fdb_get_default_kvs_config();

    // create a file
    s = fdb_open(&dbfile, "dummy", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[0], NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[1], NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(keybuf, 0x0, 256);
    memset(valuebuf, 0x0, 256);

    // insert docs & dirty WAL flushing
    for (i=0; i<1000; i++) {
        sprintf(keybuf, "k%06d", i);
        sprintf(valuebuf, "v%06d", i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 9);
        s = fdb_set(db[1], doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }

    // get docks
    for (i=0; i<1000; i++) {
        sprintf(keybuf, "k%06d", i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 9);
        s = fdb_get(db[0], doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    // now dirty blocks are cached in db[0]'s (default) bhandle

    // more dirty WAL flushing
    for (i=1000; i<3000; i++) {
        sprintf(keybuf, "k%06d", i);
        sprintf(valuebuf, "v%06d", i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 9);
        s = fdb_set(db[1], doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }

    // commit - WAL flushing is executed on the default handle
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // count # docs
    s = fdb_iterator_init(db[1], &fit, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    r = 0;
    do {
        rdoc = NULL;
        s = fdb_iterator_get(fit, &rdoc);
        if (s != FDB_RESULT_SUCCESS) break;
        r++;
        fdb_doc_free(rdoc);
    } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(fit);

    TEST_CHK(r == 3000);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("dirty index consistency test");
}